

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O2

void __thiscall ot::commissioner::MockSocket::MockSocket(MockSocket *this,MockSocket *aOther)

{
  pointer puVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  Socket::Socket(&this->super_Socket,&aOther->super_Socket);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__MockSocket_00255e20;
  puVar1 = (aOther->mLocalAddr).mBytes.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mLocalPort = aOther->mLocalPort;
  (this->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (aOther->mPeerSocket).
           super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (aOther->mPeerSocket).
           super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (aOther->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (aOther->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MockSocket::MockSocket(MockSocket &&aOther)
    : Socket(std::move(aOther))
    , mLocalAddr(std::move(aOther.mLocalAddr))
    , mLocalPort(std::move(aOther.mLocalPort))
    , mPeerSocket(std::move(aOther.mPeerSocket))
{
}